

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiMenuColumns::Update(ImGuiMenuColumns *this,float spacing,bool window_reappearing)

{
  bool window_reappearing_local;
  float spacing_local;
  ImGuiMenuColumns *this_local;
  
  if (window_reappearing) {
    memset(this->Widths,0,8);
  }
  this->Spacing = (ImU16)(int)spacing;
  CalcNextTotalWidth(this,true);
  memset(this->Widths,0,8);
  this->TotalWidth = this->NextTotalWidth;
  this->NextTotalWidth = 0;
  return;
}

Assistant:

void ImGuiMenuColumns::Update(float spacing, bool window_reappearing)
{
    if (window_reappearing)
        memset(Widths, 0, sizeof(Widths));
    Spacing = (ImU16)spacing;
    CalcNextTotalWidth(true);
    memset(Widths, 0, sizeof(Widths));
    TotalWidth = NextTotalWidth;
    NextTotalWidth = 0;
}